

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

ssize_t __thiscall bitio::stream::read(stream *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar7;
  ulong uVar8;
  bool bVar9;
  byte bVar6;
  
  if (__fd == 0) {
    uVar8 = 0;
  }
  else {
    bVar6 = (byte)__fd;
    bVar5 = bVar6 >> 3;
    bVar7 = bVar6 & 7;
    bVar1 = read_next_byte(this);
    bVar2 = 8 - this->_bit_head;
    bVar4 = bVar7 - bVar2;
    if (bVar7 < bVar2 || bVar4 == 0) {
      bVar3 = bVar2 - bVar7;
      uVar8 = (ulong)(byte)((u8_rmasks[bVar2] & bVar1) >> (bVar3 & 0x1f));
      this->_bit_head = this->_bit_head + bVar7;
      bVar4 = 0;
      if (bVar6 < 8) goto LAB_00103648;
      bVar4 = 0;
      if (bVar3 == 0) goto LAB_00103648;
      bVar5 = bVar5 - 1;
      bVar4 = 8 - bVar3;
      uVar8 = (uVar8 << (bVar3 & 0x3f)) + (ulong)(bVar1 & u8_rmasks[bVar3]);
    }
    else {
      uVar8 = (ulong)(u8_rmasks[bVar2] & bVar1);
    }
    while( true ) {
      this->_bit_head = '\b';
LAB_00103648:
      bVar9 = bVar5 == 0;
      bVar5 = bVar5 - 1;
      if (bVar9) break;
      bVar1 = read_next_byte(this);
      uVar8 = uVar8 << 8 | (ulong)bVar1;
    }
    if (bVar4 != 0) {
      bVar1 = read_next_byte(this);
      uVar8 = (uVar8 << (bVar4 & 0x3f)) + (ulong)(bVar1 >> (8 - bVar4 & 0x1f));
      this->_bit_head = this->_bit_head + bVar4;
    }
  }
  return uVar8;
}

Assistant:

uint64_t bitio::stream::read(uint8_t n) {
    if (n == 0) {
        return 0;
    }

    uint64_t value = 0;
    uint8_t nbytes = n >> 3;
    uint8_t nbits = n & 0x7;

    // First, read the leftover bits.
    uint8_t curr_byte = read_next_byte();

    uint8_t rbits = 8 - _bit_head;

    if (nbits <= rbits) {
        value = (curr_byte & u8_rmasks[rbits]) >> (rbits - nbits);
        _bit_head += nbits;
        rbits -= nbits;
        nbits = 0;
    } else {
        value = curr_byte & u8_rmasks[rbits];
        nbits -= rbits;
        rbits = 0;
        _bit_head = 8;
    }

    // Now, if we need to read some nbytes and we have leftover rbits, we borrow a byte from the stream and
    // add the carry to nbits.

    if (rbits != 0) {
        if (nbytes != 0) {
            nbytes--;
            nbits = 8 - rbits;
            value <<= rbits;
            value += curr_byte & u8_rmasks[rbits];
            _bit_head = 8;
        }
    }

    // Now, read the nbytes.
    while (nbytes--) {
        value <<= 0x8;
        value += read_next_byte();
        _bit_head = 8;
    }

    // Read the remaining nbits. We don't need masks here because, bit_head is always 8 if nbits != 0
    if (nbits != 0) {
        curr_byte = read_next_byte();
        value <<= nbits;
        value += (curr_byte >> (8 - nbits));
        _bit_head += nbits;
    }

    return value;
}